

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

int Parser::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  const_iterator cVar6;
  mapped_type *__k;
  mapped_type *__args;
  ostream *poVar7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  Rule nowRule;
  string nowString;
  ifstream in;
  bool local_2dd;
  int local_2dc;
  value_type local_2d8;
  key_type local_2b8;
  string local_298;
  string local_278;
  value_type local_258;
  string local_238 [520];
  
  getEnds();
  std::ifstream::ifstream(local_238);
  std::ifstream::open(local_238,(_Ios_Openmode)ctx);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"open ",5);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,*(char **)ctx,*(long *)(ctx + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," wrong",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  else {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    iVar4 = 0;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = true;
LAB_0010a150:
    bVar9 = bVar1;
    piVar5 = std::operator>>((istream *)local_238,(string *)&local_2b8);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
      bVar1 = true;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
        bVar1 = false;
        if (iVar3 != 0) {
          if (bVar9) {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,local_2b8._M_dataplus._M_p,
                       local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
            iVar4 = addMid(&local_298);
            bVar1 = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
              bVar1 = true;
            }
            goto LAB_0010a150;
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
          if (iVar3 == 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
            if (iVar3 != 0) {
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Parse Error","")
              ;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&errVec_abi_cxx11_,&local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parse Error",0xb);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
              std::ostream::put('0');
              std::ostream::flush();
              goto LAB_0010a429;
            }
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::push_back
                      ((vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)
                       (mids + (long)iVar4 * 0xd0 + 0x28),&local_2d8);
            bVar1 = false;
            if (local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                _M_impl.super__Vector_impl_data._M_start) goto LAB_0010a150;
            local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)endTran_abi_cxx11_,&local_2b8);
            if (cVar6._M_node == (_Base_ptr)(endTran_abi_cxx11_ + 8)) {
              iVar3 = std::__cxx11::string::compare((char *)&local_2b8);
              if (iVar3 == 0) {
                *(undefined1 *)(mids + 0x20 + (long)iVar4 * 0xd0) = 1;
              }
              else {
                local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_278,local_2b8._M_dataplus._M_p,
                           local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
                local_2dc = addMid(&local_278);
                local_2dd = false;
                std::vector<Parser::Node,std::allocator<Parser::Node>>::emplace_back<int,bool>
                          ((vector<Parser::Node,std::allocator<Parser::Node>> *)&local_2d8,
                           &local_2dc,&local_2dd);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p,
                                  local_278.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              __k = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)endTran_abi_cxx11_,&local_2b8);
              __args = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)endToId_abi_cxx11_,__k);
              local_2dc = CONCAT31(local_2dc._1_3_,1);
              std::vector<Parser::Node,std::allocator<Parser::Node>>::emplace_back<int&,bool>
                        ((vector<Parser::Node,std::allocator<Parser::Node>> *)&local_2d8,__args,
                         (bool *)&local_2dc);
            }
          }
          bVar1 = false;
        }
      }
      goto LAB_0010a150;
    }
    eliPassRecur();
    eliCommonPreffix();
    eliNone();
    getFirstSet();
    getEndSet();
    getSelectSet();
    if (DAT_00127500 != mids) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        print((Mid *)(mids + lVar10));
        uVar11 = uVar11 + 1;
        uVar8 = (DAT_00127500 - mids >> 4) * 0x4ec4ec4ec4ec4ec5;
        lVar10 = lVar10 + 0xd0;
      } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
    }
LAB_0010a429:
    if (local_2d8.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.rights.
                      super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d8.rights.
                            super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d8.rights.
                            super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                               local_2b8.field_2._M_local_buf[0]) + 1);
    }
  }
  iVar4 = std::ifstream::~ifstream(local_238);
  return iVar4;
}

Assistant:

void init(const string &fileName){
        getEnds();
        ifstream in;
        in.open(fileName);
        if(!in.is_open()){
            cerr<<"open "<<fileName<<" wrong"<<endl;
            return;
        }
        string nowString;
        Rule nowRule;
        int stat=0,nowMid=0;
        while(in>>nowString){
            if(nowString=="#"){
                stat = 0;
            }else if(nowString=="->"){
                stat = 1;
            }else if(stat==0){
                nowMid = addMid(nowString);
            }else if(nowString != "$"){
                if(endTran.count(nowString)){
                    nowRule.rights.emplace_back(endToId[endTran[nowString]],true);
                }else if(nowString == "none"){
                    mids[nowMid].canNone = true;
                }else{
                    nowRule.rights.emplace_back(addMid(nowString),false);
                }
            }else if(nowString == "$"){
                mids[nowMid].rules.push_back(nowRule);
                nowRule.rights.clear();
            }else{
                ERROR("Parse Error");
                cerr<<"Parse Error"<<endl;
                return;
            }
        }
        eliPassRecur();
        eliCommonPreffix();
        eliNone();
        getFirstSet();
        getEndSet();
        getSelectSet();
        // for(int i = 0;i < mids.size();i++){
        //     cout<<mids[i].sgn<<" -> ";
        //     for(auto t:mids[i].follow){
        //         cout<<ends[t]<<" ";
        //     }
        //     cout<<endl;
        // }
        for(int i = 0;i < mids.size();i++){
            print(mids[i]);
        }
    }